

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

char * get_default_font(wchar_t term_num)

{
  char local_78 [8];
  char buf [80];
  char *font;
  char *pcStack_10;
  wchar_t term_num_local;
  
  strnfmt(local_78,0x50,"ANGBAND_X11_FONT_%d",(ulong)(uint)term_num);
  pcStack_10 = getenv(local_78);
  if ((pcStack_10 == (char *)0x0) &&
     (pcStack_10 = getenv("ANGBAND_X11_FONT"), pcStack_10 == (char *)0x0)) {
    switch(term_num) {
    case L'\0':
      pcStack_10 = "10x20";
      break;
    case L'\x01':
      pcStack_10 = "9x15";
      break;
    case L'\x02':
      pcStack_10 = "9x15";
      break;
    case L'\x03':
      pcStack_10 = "7x13";
      break;
    case L'\x04':
      pcStack_10 = "7x13";
      break;
    case L'\x05':
      pcStack_10 = "7x13";
      break;
    case L'\x06':
      pcStack_10 = "7x13";
      break;
    case L'\a':
      pcStack_10 = "7x13";
      break;
    default:
      pcStack_10 = "9x15";
    }
  }
  return pcStack_10;
}

Assistant:

static const char *get_default_font(int term_num)
{
	const char *font;
	char buf[80];

	/* Window specific font name */
	strnfmt(buf, sizeof(buf), "ANGBAND_X11_FONT_%d", term_num);

	/* Check environment for that font */
	font = getenv(buf);
	if (font) return font;

	/* Check environment for "base" font */
	font = getenv("ANGBAND_X11_FONT");
	if (font) return font;

	switch (term_num)
	{
		case 0:
			return DEFAULT_X11_FONT_0;
		case 1:
			return DEFAULT_X11_FONT_1;
		case 2:
			return DEFAULT_X11_FONT_2;
		case 3:
			return DEFAULT_X11_FONT_3;
		case 4:
			return DEFAULT_X11_FONT_4;
		case 5:
			return DEFAULT_X11_FONT_5;
		case 6:
			return DEFAULT_X11_FONT_6;
		case 7:
			return DEFAULT_X11_FONT_7;
	}

	return DEFAULT_X11_FONT;
}